

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_test.pb.cc
# Opt level: O3

size_t __thiscall proto2_unittest::TestAny::ByteSizeLong(TestAny *this)

{
  int iVar1;
  long lVar2;
  int iVar3;
  anon_union_56_1_493b367e_for_TestAny_3 aVar4;
  uint uVar5;
  Rep *pRVar6;
  size_t sVar7;
  ulong uVar8;
  RepeatedPtrField<google::protobuf::Any> *this_00;
  size_t sVar9;
  RepeatedPtrField<google::protobuf::Any> *pRVar10;
  
  sVar9 = (size_t)*(int *)((long)&this->field_0 + 0x10);
  this_00 = &(this->field_0)._impl_.repeated_any_value_;
  pRVar10 = this_00;
  if ((undefined1  [56])((undefined1  [56])this->field_0 & (undefined1  [56])0x1) !=
      (undefined1  [56])0x0) {
    pRVar6 = google::protobuf::internal::RepeatedPtrFieldBase::rep
                       (&this_00->super_RepeatedPtrFieldBase);
    pRVar10 = (RepeatedPtrField<google::protobuf::Any> *)pRVar6->elements;
    if (((ulong)(this_00->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
      pRVar6 = google::protobuf::internal::RepeatedPtrFieldBase::rep
                         (&this_00->super_RepeatedPtrFieldBase);
      this_00 = (RepeatedPtrField<google::protobuf::Any> *)pRVar6->elements;
    }
  }
  iVar1 = *(int *)((long)&this->field_0 + 0x10);
  for (; pRVar10 !=
         (RepeatedPtrField<google::protobuf::Any> *)
         (&(this_00->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ + iVar1);
      pRVar10 = (RepeatedPtrField<google::protobuf::Any> *)
                &(pRVar10->super_RepeatedPtrFieldBase).current_size_) {
    sVar7 = google::protobuf::Any::ByteSizeLong
                      ((Any *)(pRVar10->super_RepeatedPtrFieldBase).tagged_rep_or_elem_);
    uVar5 = (uint)sVar7 | 1;
    iVar3 = 0x1f;
    if (uVar5 != 0) {
      for (; uVar5 >> iVar3 == 0; iVar3 = iVar3 + -1) {
      }
    }
    sVar9 = sVar9 + sVar7 + (ulong)(iVar3 * 9 + 0x49U >> 6);
  }
  aVar4 = this->field_0;
  if (((undefined1  [56])aVar4 & (undefined1  [56])0x7) != (undefined1  [56])0x0) {
    if ((((undefined1  [56])aVar4 & (undefined1  [56])0x1) != (undefined1  [56])0x0) &&
       (lVar2 = *(long *)(((ulong)(this->field_0)._impl_.text_.tagged_ptr_.ptr_ & 0xfffffffffffffffc
                          ) + 8), lVar2 != 0)) {
      uVar5 = (uint)lVar2 | 1;
      iVar1 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      sVar9 = sVar9 + lVar2 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 1;
    }
    if (((undefined1  [56])aVar4 & (undefined1  [56])0x2) != (undefined1  [56])0x0) {
      sVar7 = google::protobuf::Any::ByteSizeLong((this->field_0)._impl_.any_value_);
      uVar5 = (uint)sVar7 | 1;
      iVar1 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      sVar9 = sVar9 + sVar7 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 1;
    }
    if ((((undefined1  [56])aVar4 & (undefined1  [56])0x4) != (undefined1  [56])0x0) &&
       (uVar8 = (ulong)(this->field_0)._impl_.int32_value_, uVar8 != 0)) {
      uVar8 = uVar8 | 1;
      lVar2 = 0x3f;
      if (uVar8 != 0) {
        for (; uVar8 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      sVar9 = sVar9 + ((int)lVar2 * 9 + 0x89U >> 6);
    }
  }
  sVar9 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sVar9,&(this->field_0)._impl_._cached_size_);
  return sVar9;
}

Assistant:

::size_t TestAny::ByteSizeLong() const {
  const TestAny& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:proto2_unittest.TestAny)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated .google.protobuf.Any repeated_any_value = 3;
    {
      total_size += 1UL * this_._internal_repeated_any_value_size();
      for (const auto& msg : this_._internal_repeated_any_value()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
  }
  cached_has_bits = this_._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000007u) != 0) {
    // string text = 4;
    if ((cached_has_bits & 0x00000001u) != 0) {
      if (!this_._internal_text().empty()) {
        total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                        this_._internal_text());
      }
    }
    // .google.protobuf.Any any_value = 2;
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.any_value_);
    }
    // int32 int32_value = 1;
    if ((cached_has_bits & 0x00000004u) != 0) {
      if (this_._internal_int32_value() != 0) {
        total_size += ::_pbi::WireFormatLite::Int32SizePlusOne(
            this_._internal_int32_value());
      }
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}